

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathReleaseObject(xmlXPathContextPtr ctxt,xmlXPathObjectPtr obj)

{
  undefined8 *puVar1;
  xmlNodePtr ns;
  int iVar2;
  int i;
  long lVar3;
  xmlNodeSetPtr *ppxVar4;
  xmlNodeSetPtr tmpset;
  xmlNodeSetPtr obj_00;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  if ((ctxt == (xmlXPathContextPtr)0x0) ||
     (puVar1 = (undefined8 *)ctxt->cache, puVar1 == (undefined8 *)0x0)) {
    xmlXPathFreeObject(obj);
    return;
  }
  switch(obj->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    obj_00 = obj->nodesetval;
    if (obj_00 == (xmlNodeSetPtr)0x0) goto switchD_001b9cc3_caseD_2;
    if ((0x28 < obj_00->nodeMax) ||
       (iVar2 = *(int *)(puVar1 + 2), *(int *)((long)puVar1 + 0x14) <= iVar2)) {
      ppxVar4 = &obj->nodesetval;
      xmlXPathFreeNodeSet(obj_00);
      goto LAB_001b9d2f;
    }
    obj->stringval = (xmlChar *)*puVar1;
    *puVar1 = obj;
    *(int *)(puVar1 + 2) = iVar2 + 1;
    obj->boolval = 0;
    goto LAB_001b9d63;
  case XPATH_BOOLEAN:
  case XPATH_NUMBER:
    goto switchD_001b9cc3_caseD_2;
  case XPATH_STRING:
    ppxVar4 = (xmlNodeSetPtr *)&obj->stringval;
    if (obj->stringval != (xmlChar *)0x0) {
      (*xmlFree)(obj->stringval);
    }
LAB_001b9d2f:
    *ppxVar4 = (xmlNodeSetPtr)0x0;
switchD_001b9cc3_caseD_2:
    iVar2 = *(int *)(puVar1 + 3);
    if (*(int *)((long)puVar1 + 0x1c) <= iVar2) {
switchD_001b9cc3_caseD_5:
      if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
        xmlXPathFreeNodeSet(obj->nodesetval);
      }
      (*xmlFree)(obj);
      return;
    }
    obj->stringval = (xmlChar *)puVar1[1];
    puVar1[1] = obj;
    *(int *)(puVar1 + 3) = iVar2 + 1;
    obj_00 = obj->nodesetval;
    obj->boolval = 0;
    if (obj_00 != (xmlNodeSetPtr)0x0) {
LAB_001b9d63:
      iVar2 = obj_00->nodeNr;
      if (0 < iVar2) {
        lVar3 = 0;
        do {
          ns = obj_00->nodeTab[lVar3];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
            iVar2 = obj_00->nodeNr;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar2);
      }
      obj_00->nodeNr = 0;
    }
    return;
  default:
    goto switchD_001b9cc3_caseD_5;
  }
}

Assistant:

static void
xmlXPathReleaseObject(xmlXPathContextPtr ctxt, xmlXPathObjectPtr obj)
{
    if (obj == NULL)
	return;
    if ((ctxt == NULL) || (ctxt->cache == NULL)) {
	 xmlXPathFreeObject(obj);
    } else {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	switch (obj->type) {
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		if (obj->nodesetval != NULL) {
		    if ((obj->nodesetval->nodeMax <= 40) &&
			(cache->numNodeset < cache->maxNodeset)) {
                        obj->stringval = (void *) cache->nodesetObjs;
                        cache->nodesetObjs = obj;
                        cache->numNodeset += 1;
			goto obj_cached;
		    } else {
			xmlXPathFreeNodeSet(obj->nodesetval);
			obj->nodesetval = NULL;
		    }
		}
		break;
	    case XPATH_STRING:
		if (obj->stringval != NULL)
		    xmlFree(obj->stringval);
                obj->stringval = NULL;
		break;
	    case XPATH_BOOLEAN:
	    case XPATH_NUMBER:
		break;
	    default:
		goto free_obj;
	}

	/*
	* Fallback to adding to the misc-objects slot.
	*/
        if (cache->numMisc >= cache->maxMisc)
	    goto free_obj;
        obj->stringval = (void *) cache->miscObjs;
        cache->miscObjs = obj;
        cache->numMisc += 1;

obj_cached:
        obj->boolval = 0;
	if (obj->nodesetval != NULL) {
	    xmlNodeSetPtr tmpset = obj->nodesetval;

	    /*
	    * Due to those nasty ns-nodes, we need to traverse
	    * the list and free the ns-nodes.
	    */
	    if (tmpset->nodeNr > 0) {
		int i;
		xmlNodePtr node;

		for (i = 0; i < tmpset->nodeNr; i++) {
		    node = tmpset->nodeTab[i];
		    if ((node != NULL) &&
			(node->type == XML_NAMESPACE_DECL))
		    {
			xmlXPathNodeSetFreeNs((xmlNsPtr) node);
		    }
		}
	    }
	    tmpset->nodeNr = 0;
        }

	return;

free_obj:
	/*
	* Cache is full; free the object.
	*/
	if (obj->nodesetval != NULL)
	    xmlXPathFreeNodeSet(obj->nodesetval);
	xmlFree(obj);
    }
}